

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc.cpp
# Opt level: O2

char * Am_Merge_Pathname(char *name)

{
  bool bVar1;
  ostream *poVar2;
  string *psVar3;
  char *__dest;
  char *__src;
  Am_Filename found;
  Am_Filename local_50;
  Am_Filename local_30;
  
  local_50.filename._M_dataplus._M_p = (pointer)&local_50.filename.field_2;
  local_50.filename._M_string_length = 0;
  local_50.filename.field_2._M_local_buf[0] = '\0';
  Am_Filename::Am_Filename(&local_30,name);
  bVar1 = Am_Data_Locator::Find_File(&Am_Default_Data_Locator,&local_30,&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Unable to locate file \'");
    poVar2 = std::operator<<(poVar2,name);
    poVar2 = std::operator<<(poVar2,"\'");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  psVar3 = Am_Filename::name_abi_cxx11_(&local_50);
  __dest = (char *)operator_new__(psVar3->_M_string_length + 1);
  __src = Am_Filename::c_str(&local_50);
  strcpy(__dest,__src);
  std::__cxx11::string::~string((string *)&local_50);
  return __dest;
}

Assistant:

const char *
Am_Merge_Pathname(const char *name)
{
#if 0
  const char *am_dir = Am_Get_Amulet_Pathname();
  if (!am_dir) am_dir = "..";
  char *ret_val = new char [(strlen(am_dir) + strlen(name) + 2)];

  strcpy(ret_val, am_dir);
  strcat(ret_val, "/");
  strcat(ret_val, name);
  return ret_val;
#else
  Am_Filename found;
  const bool ok = Am_Default_Data_Locator.Find_File(name, found);
  if (!ok) {
    std::cout << "Unable to locate file '" << name << "'" << std::endl;
  }
  char *ret_val = new char[found.name().length() + 1];
  strcpy(ret_val, found.c_str());
  return ret_val;
#endif
}